

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-elastic-local-frame-dynamical-system.cpp
# Opt level: O2

void __thiscall
stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::
computeElastPendulumForcesAndMoments1
          (IMUElasticLocalFrameDynamicalSystem *this,IndexedMatrixArray *PrArray,Vector3 *position,
          Vector3 *linVelocity,Vector3 *oriVector,Matrix3 *orientation,Vector3 *angVel,
          Vector *forces,Vector *moments)

{
  uint uVar1;
  double dVar2;
  IMUElasticLocalFrameDynamicalSystem *pIVar3;
  uint time;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
  *local_170 [3];
  Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_158;
  Vector3 *local_140;
  RhsNested local_130;
  IMUElasticLocalFrameDynamicalSystem *local_128;
  Matrix3 *local_120;
  Matrix3 *local_118;
  Vector3 *local_110;
  Vector3 *local_108;
  double local_100;
  Matrix<double,_3,_1,_0,_3,_1> *local_f8;
  RhsNested local_f0 [2];
  undefined4 local_e0;
  uint uStack_dc;
  undefined4 uStack_d8;
  uint uStack_d4;
  RhsNested local_d0;
  LhsNested local_c8;
  undefined4 local_c0;
  uint uStack_bc;
  undefined4 uStack_b8;
  uint uStack_b4;
  undefined8 local_b0;
  Vector3 u;
  Lhs local_88;
  Vector3 du;
  Vector3 momenti;
  Vector3 forcei;
  
  uVar1 = this->nbContacts_;
  local_130 = (RhsNested)oriVector;
  local_110 = linVelocity;
  local_108 = position;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)forces);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)moments);
  local_118 = &this->KfeRopes_;
  local_120 = &this->KfvRopes_;
  local_128 = this;
  for (time = 0; pIVar3 = local_128, uVar1 != time; time = time + 1) {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)&u,local_108);
    IndexedMatrixArray::operator[]((Matrix *)local_f0,PrArray,time);
    local_158.m_lhs =
         (LhsNested)
         Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                   ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)orientation,
                    (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_f0);
    local_170[0] = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                    *)&u;
    Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator+=
              ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)local_170,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)&local_158);
    free(local_f0[0]);
    local_f0[0] = (RhsNested)&u;
    Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator-=
              ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)local_f0,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&this->pe);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>(&du,local_110);
    local_c8 = (LhsNested)
               (angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[0];
    uStack_b8 = SUB84(local_c8,0);
    local_f0[0] = (RhsNested)0x0;
    local_e0 = *(undefined4 *)
                ((angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array + 1);
    uStack_bc = *(uint *)((long)(angVel->
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                m_storage.m_data.array + 0xc);
    uStack_d8 = *(undefined4 *)
                 ((angVel->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array + 2);
    uStack_dc = uStack_bc ^ 0x80000000;
    uStack_d4 = *(uint *)((long)(angVel->
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                m_storage.m_data.array + 0x14) ^ 0x80000000;
    local_d0 = (RhsNested)0x0;
    uStack_b4 = (uint)((ulong)local_c8 >> 0x20) ^ 0x80000000;
    local_b0 = 0;
    local_c0 = local_e0;
    local_88.m_lhs = (LhsNested)local_f0;
    local_88.m_rhs = orientation;
    IndexedMatrixArray::operator[]((Matrix *)local_170,PrArray,time);
    Eigen::
    Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
    ::Product(&local_158,&local_88,(Rhs *)local_170);
    local_f8 = &du;
    Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator+=
              ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_f8,
               (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)&local_158);
    free(local_170[0]);
    IndexedMatrixArray::operator[]((Matrix *)&local_158,PrArray,time);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                *)local_f0,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_158,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&this->pe);
    local_100 = Eigen::
                MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)local_f0);
    free(local_158.m_lhs.m_lhs);
    dVar2 = SQRT((double)CONCAT44(u.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[2]._4_4_,
                                  u.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[2]._0_4_) *
                 (double)CONCAT44(u.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[2]._4_4_,
                                  u.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[2]._0_4_) +
                 (double)CONCAT44(u.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[1]._4_4_,
                                  u.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[1]._0_4_) *
                 (double)CONCAT44(u.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[1]._4_4_,
                                  u.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[1]._0_4_) +
                 u.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0] *
                 u.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array[0]);
    local_170[0] = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                    *)(-(dVar2 - local_100) / dVar2);
    local_158.m_lhs.m_lhs = local_118;
    local_158.m_rhs = (RhsNested)local_120;
    local_140 = &du;
    local_158.m_lhs.m_rhs = (RhsNested)&u;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                      *)local_f0,(double *)local_170,(StorageBaseType *)&local_158);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)&forcei,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                *)local_f0);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_f0,forces,0,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>>::operator+=
              ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>> *)local_f0,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&forcei);
    local_f0[0] = (RhsNested)0x0;
    uStack_dc = u.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1]._4_4_ ^ 0x80000000;
    uStack_d4 = u.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[2]._4_4_ ^ 0x80000000;
    local_e0 = u.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [1]._0_4_;
    uStack_d8 = u.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[2]._0_4_;
    local_d0 = (RhsNested)0x0;
    uStack_b8 = SUB84(u.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array[0],0);
    local_c8 = (LhsNested)
               u.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [0];
    uStack_b4 = (uint)((ulong)u.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                              m_storage.m_data.array[0] >> 0x20) ^ 0x80000000;
    local_c0 = u.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [1]._0_4_;
    uStack_bc = u.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array[1]._4_4_;
    local_b0 = 0;
    local_158.m_lhs.m_rhs = (RhsNested)&forcei;
    local_158.m_lhs.m_lhs = (LhsNested)local_f0;
    local_170[0] = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                    *)&momenti;
    Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)local_170,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&local_158);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_f0,moments,0,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>>::operator+=
              ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>> *)local_f0,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&momenti);
  }
  local_158.m_rhs = local_130;
  local_158.m_lhs.m_lhs = &local_128->KteRopes_;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_f0,moments,0,3);
  local_170[0] = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                  *)local_f0;
  Eigen::NoAlias<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>,Eigen::MatrixBase>::
  operator+=((NoAlias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::MatrixBase> *
             )local_170,
             (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)&local_158);
  local_158.m_lhs.m_lhs = &pIVar3->KtvRopes_;
  local_158.m_rhs = (RhsNested)angVel;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)local_f0,moments,0,3);
  local_170[0] = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                  *)local_f0;
  Eigen::NoAlias<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>,Eigen::MatrixBase>::
  operator+=((NoAlias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::MatrixBase> *
             )local_170,
             (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)&local_158);
  if (pIVar3->printed_ == false) {
    pIVar3->printed_ = true;
  }
  return;
}

Assistant:

void IMUElasticLocalFrameDynamicalSystem::computeElastPendulumForcesAndMoments1
                              (const IndexedMatrixArray& PrArray,
                               const Vector3& position, const Vector3& linVelocity,
                               const Vector3& oriVector, const Matrix3& orientation,
                               const Vector3& angVel,
                               Vector& forces, Vector& moments)
    {
        unsigned nbContacts(getContactsNumber());
        forces.setZero(); moments.setZero();

        stateObservation::Vector3 forcei;
        stateObservation::Vector3 momenti;
        stateObservation::Vector3 u, du;

        double ropeLength;
        double modifiedRopeLength;
        double lengthRate;

        for (unsigned i = 0; i<nbContacts ; ++i)
        {
            u = position;
            u.noalias() += orientation*PrArray[i] ;
            u.noalias() -= pe;

            du = linVelocity;
            du.noalias() += kine::skewSymmetric(angVel)*orientation*PrArray[i] ;

            ropeLength=(PrArray[i]-pe).norm();
            modifiedRopeLength=u.norm();

            lengthRate=(modifiedRopeLength-ropeLength)/modifiedRopeLength;

            forcei = -lengthRate*(KfeRopes_*u+KfvRopes_*du);
            forces.segment<3>(0) += forcei;

            momenti.noalias() = kine::skewSymmetric(u)*forcei;
            moments.segment<3>(0) += momenti;
        }

        moments.segment<3>(0).noalias() += - KteRopes_*oriVector;
        moments.segment<3>(0).noalias() += - KtvRopes_*angVel;

        if(printed_==false)
        {
    //            std::cout << "ropeLength=" << ropeLength << std::endl;
    //        std::cout << "modifiedRopeLength=" << modifiedRopeLength << std::endl;
    //            std::cout << "contactOriUnitVector=" << contactOriUnitVector.transpose() << std::endl;
    //            std::cout << "forcei=" << forcei.transpose() << std::endl;
    //            std::cout << "momenti=" << momenti.transpose() << std::endl;
            printed_=true;
        }

    }